

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

bool __thiscall
Clasp::mt::SharedLitsClause::minimize
          (SharedLitsClause *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  uint uVar1;
  uint uVar2;
  SharedLiterals *pSVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((((s->strategy_).field_0x5 & 0x40) == 0) &&
     (uVar1 = (this->super_ClauseHead).info_.super_ConstraintScore.rep, (~uVar1 & 0xfffff) != 0)) {
    (this->super_ClauseHead).info_.super_ConstraintScore.rep = uVar1 + 1;
  }
  pSVar3 = (this->super_ClauseHead).field_0.shared_;
  uVar1 = pSVar3->size_type_;
  bVar6 = uVar1 < 4;
  if (!bVar6) {
    uVar5 = 0;
    do {
      uVar2 = *(uint *)((long)&pSVar3[1].refCount_.super___atomic_base<int>._M_i + uVar5);
      if ((1 < (uVar2 ^ p.rep_)) &&
         (bVar4 = Solver::ccMinimize(s,(Literal)(uVar2 & 0xfffffffe ^ 2),rec), !bVar4)) {
        return bVar6;
      }
      uVar5 = uVar5 + 4;
      bVar6 = (uVar1 & 0xfffffffc) == uVar5;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

bool SharedLitsClause::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	s.updateOnMinimize(info_.score());
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if (*r != p && !s.ccMinimize(~*r, rec)) { return false; }
	}
	return true;
}